

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

void handleSelectionRequest(XEvent *event)

{
  Atom *pAVar1;
  Atom AVar2;
  Atom AVar3;
  undefined8 uVar4;
  Display *pDVar5;
  unsigned_long uVar6;
  long lVar7;
  Atom AVar8;
  ulong uVar9;
  Window WVar10;
  undefined8 uStackY_170;
  Atom *__s;
  size_t sVar11;
  Atom formats [3];
  Atom targets [5];
  undefined4 local_f0 [6];
  Display *local_d8;
  int local_d0;
  int iStack_cc;
  int iStack_c8;
  int iStack_c4;
  Time local_c0;
  Atom local_b8;
  Window local_b0;
  
  AVar8 = 0;
  uVar9 = 0;
  memset(local_f0,0,0xc0);
  pDVar5 = _glfw.x11.display;
  formats[0] = _glfw.x11.UTF8_STRING;
  formats[1] = _glfw.x11.COMPOUND_STRING;
  formats[2] = 0x1f;
  AVar2 = (event->xselectionrequest).property;
  if (AVar2 == 0) goto LAB_00186911;
  AVar3 = (event->xselectionrequest).target;
  if (AVar3 == _glfw.x11.TARGETS) {
    __s = targets;
    targets[1] = _glfw.x11.MULTIPLE;
    targets[2] = _glfw.x11.UTF8_STRING;
    targets[3] = _glfw.x11.COMPOUND_STRING;
    targets[4] = 0x1f;
    WVar10 = (event->xkey).root;
    uStackY_170 = 0x20;
    sVar11 = 5;
    AVar8 = 4;
    targets[0] = AVar3;
LAB_001867d1:
    XChangeProperty(pDVar5,WVar10,AVar2,AVar8,uStackY_170,0,__s,sVar11);
  }
  else {
    __s = *(Atom **)(_glfw.x11.keyName +
                    (ulong)((event->xkey).subwindow != _glfw.x11.PRIMARY) * 8 + -0x10);
    if (AVar3 != _glfw.x11.MULTIPLE) {
      if (AVar3 == _glfw.x11.SAVE_TARGETS) {
        WVar10 = (event->xkey).root;
        sVar11 = uVar9 & 0xffffffff00000000;
        __s = (Atom *)0x0;
        uStackY_170 = 0x20;
        AVar8 = _glfw.x11.NULL_;
      }
      else {
        AVar8 = 0;
        lVar7 = 0;
        do {
          if (lVar7 == 3) goto LAB_00186911;
          pAVar1 = formats + lVar7;
          lVar7 = lVar7 + 1;
        } while (AVar3 != *pAVar1);
        WVar10 = (event->xkey).root;
        sVar11 = strlen((char *)__s);
        uStackY_170 = 8;
        AVar8 = AVar3;
      }
      goto LAB_001867d1;
    }
    uVar6 = _glfwGetWindowPropertyX11
                      ((event->xkey).root,AVar2,_glfw.x11.ATOM_PAIR,(uchar **)targets);
    for (uVar9 = 0; pDVar5 = _glfw.x11.display, uVar9 < uVar6; uVar9 = uVar9 + 2) {
      AVar2 = *(Atom *)(targets[0] + uVar9 * 8);
      lVar7 = 0;
      do {
        if (lVar7 == 3) {
          *(undefined8 *)(targets[0] + 8 + uVar9 * 8) = 0;
          goto LAB_00186898;
        }
        pAVar1 = formats + lVar7;
        lVar7 = lVar7 + 1;
      } while (AVar2 != *pAVar1);
      WVar10 = (event->xkey).root;
      uVar4 = *(undefined8 *)(targets[0] + 8 + uVar9 * 8);
      sVar11 = strlen((char *)__s);
      XChangeProperty(pDVar5,WVar10,uVar4,AVar2,8,0,__s,sVar11);
LAB_00186898:
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0);
    XFree(targets[0]);
  }
  AVar8 = (event->xselectionrequest).property;
LAB_00186911:
  local_f0[0] = 0x1f;
  local_d8 = (event->xany).display;
  local_d0 = (event->xfocus).mode;
  iStack_cc = (event->xfocus).detail;
  iStack_c8 = (event->xexpose).width;
  iStack_c4 = (event->xexpose).height;
  local_c0 = (event->xkey).time;
  local_b0 = (event->xconfigure).above;
  local_b8 = AVar8;
  XSendEvent(_glfw.x11.display,(event->xkey).root,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply;
    memset(&reply, 0, sizeof(reply));

    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.type = SelectionNotify;
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}